

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              secp256k1_sha256 *s2c_sha,secp256k1_ecdsa_s2c_opening *s2c_opening,uchar *s2c_data32,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  int *in_RCX;
  secp256k1_scalar *in_RDX;
  secp256k1_scalar *in_RSI;
  secp256k1_context *in_RDI;
  secp256k1_ecdsa_s2c_opening *in_R9;
  long in_stack_00000008;
  int zero;
  secp256k1_ge nonce_p;
  secp256k1_gej nonce_pj;
  int is_nonce_valid;
  uint count;
  uchar nonce32 [32];
  int is_sec_valid;
  int ret;
  secp256k1_scalar msg;
  secp256k1_scalar non;
  secp256k1_scalar sec;
  int *in_stack_fffffffffffffe58;
  undefined3 in_stack_fffffffffffffe60;
  undefined4 uVar2;
  int in_stack_fffffffffffffe64;
  uchar *in_stack_fffffffffffffe68;
  secp256k1_scalar *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe80;
  uchar *in_stack_fffffffffffffe88;
  secp256k1_sha256 *in_stack_fffffffffffffe90;
  secp256k1_ge *in_stack_fffffffffffffe98;
  secp256k1_scalar *in_stack_fffffffffffffea0;
  secp256k1_gej *in_stack_fffffffffffffea8;
  secp256k1_ge *in_stack_fffffffffffffeb0;
  undefined1 auStack_148 [120];
  secp256k1_scalar *in_stack_ffffffffffffff30;
  secp256k1_gej *in_stack_ffffffffffffff38;
  int iVar3;
  undefined1 local_b8 [32];
  uint local_98;
  uint local_94 [7];
  secp256k1_scalar *in_stack_ffffffffffffff88;
  secp256k1_scalar *in_stack_ffffffffffffff90;
  secp256k1_scalar *in_stack_ffffffffffffff98;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  secp256k1_scalar *in_stack_ffffffffffffffa8;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffc0;
  
  local_94[0] = 0;
  iVar3 = 0;
  in_RSI->d[0] = 0;
  in_RSI->d[1] = 0;
  in_RSI->d[2] = 0;
  in_RSI->d[3] = 0;
  in_RDX->d[0] = 0;
  in_RDX->d[1] = 0;
  in_RDX->d[2] = 0;
  in_RDX->d[3] = 0;
  if (in_RCX != (int *)0x0) {
    *in_RCX = 0;
  }
  if (nonce_p.x.n[2] == 0) {
    nonce_p.x.n[2] = (uint64_t)nonce_function_rfc6979;
  }
  uVar2 = CONCAT13(1,in_stack_fffffffffffffe60);
  if (in_stack_00000008 != 0) {
    uVar2 = CONCAT13((code *)nonce_p.x.n[2] == nonce_function_rfc6979,in_stack_fffffffffffffe60);
  }
  local_98 = secp256k1_scalar_set_b32_seckey
                       ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffe64,uVar2),
                        (uchar *)in_stack_fffffffffffffe58);
  secp256k1_scalar_cmov
            ((secp256k1_scalar *)&stack0xffffffffffffffb0,&secp256k1_scalar_one,
             (uint)((local_98 != 0 ^ 0xffU) & 1));
  secp256k1_scalar_set_b32
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (int *)CONCAT44(in_stack_fffffffffffffe64,uVar2));
  while( true ) {
    iVar1 = (*(code *)nonce_p.x.n[2])(local_b8,nonce_p.x.n[0],nonce_p.x.n[1],0,nonce_p.x.n[3],iVar3)
    ;
    local_94[0] = (uint)(iVar1 != 0);
    if (local_94[0] == 0) break;
    iVar1 = secp256k1_scalar_set_b32_seckey
                      ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffe64,uVar2),
                       (uchar *)in_stack_fffffffffffffe58);
    secp256k1_declassify(in_RDI,&stack0xffffffffffffff40,4);
    if (iVar1 != 0) {
      if (in_stack_00000008 != 0) {
        secp256k1_ecmult_gen
                  ((secp256k1_ecmult_gen_context *)CONCAT44(iVar3,iVar1),in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30);
        secp256k1_ge_set_gej(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        if (in_R9 != (secp256k1_ecdsa_s2c_opening *)0x0) {
          secp256k1_ecdsa_s2c_opening_save(in_R9,(secp256k1_ge *)&stack0xfffffffffffffe68);
        }
        secp256k1_declassify(in_RDI,auStack_148,4);
        local_94[0] = secp256k1_ec_commit_seckey
                                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                                 in_stack_fffffffffffffe80);
        secp256k1_declassify(in_RDI,local_94,4);
        if (local_94[0] == 0) goto LAB_00103bf3;
      }
      in_stack_fffffffffffffe58 = in_RCX;
      local_94[0] = secp256k1_ecdsa_sig_sign
                              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                               in_stack_ffffffffffffffc0);
      secp256k1_declassify(in_RDI,local_94,4);
      if (local_94[0] != 0) goto LAB_00103bf3;
    }
    iVar3 = iVar3 + 1;
  }
  local_94[0] = 0;
LAB_00103bf3:
  local_94[0] = local_98 & local_94[0];
  memset(local_b8,0,0x20);
  secp256k1_scalar_clear((secp256k1_scalar *)(local_94 + 1));
  secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff90);
  secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffffb0);
  secp256k1_scalar_cmov(in_RSI,&secp256k1_scalar_zero,(uint)((local_94[0] != 0 ^ 0xffU) & 1));
  secp256k1_scalar_cmov(in_RDX,&secp256k1_scalar_zero,(uint)((local_94[0] != 0 ^ 0xffU) & 1));
  if (in_RCX != (int *)0x0) {
    secp256k1_int_cmov(in_RCX,(int *)&stack0xfffffffffffffe64,(uint)((local_94[0] != 0 ^ 0xffU) & 1)
                      );
  }
  return local_94[0];
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, secp256k1_sha256* s2c_sha, secp256k1_ecdsa_s2c_opening *s2c_opening, const unsigned char* s2c_data32, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }
    /* sign-to-contract commitments only work with the default nonce function,
     * because we need to ensure that s2c_data is actually hashed into the nonce and
     * not just ignored. Otherwise an attacker can exfiltrate the secret key by
     * signing the same message thrice with different commitments. */
    VERIFY_CHECK(s2c_data32 == NULL || noncefp == secp256k1_nonce_function_default);

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            if (s2c_data32 != NULL) {
                secp256k1_gej nonce_pj;
                secp256k1_ge nonce_p;

                /* Compute original nonce commitment/pubkey */
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_pj, &non);
                secp256k1_ge_set_gej(&nonce_p, &nonce_pj);
                if (s2c_opening != NULL) {
                    secp256k1_ecdsa_s2c_opening_save(s2c_opening, &nonce_p);
                }

                /* Because the nonce is valid, the nonce point isn't the point
                 * at infinity and we can declassify that information to be able to
                 * serialize the point. */
                secp256k1_declassify(ctx, &nonce_p.infinity, sizeof(nonce_p.infinity));

                /* Tweak nonce with s2c commitment. */
                ret = secp256k1_ec_commit_seckey(&non, &nonce_p, s2c_sha, s2c_data32, 32);
                secp256k1_declassify(ctx, &ret, sizeof(ret)); /* may be secret that the tweak falied, but happens with negligible probability */
                if (!ret) {
                    break;
                }
            }

            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}